

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

int http_should_keep_alive_(http_parser *parser)

{
  int iVar1;
  http_parser *parser_local;
  
  if ((parser->http_major == 0) || (parser->http_minor == 0)) {
    if ((*(byte *)parser >> 2 & 2) == 0) {
      return 0;
    }
  }
  else if ((*(byte *)parser >> 2 & 4) != 0) {
    return 0;
  }
  iVar1 = http_message_needs_eof_(parser);
  return (uint)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

int
http_should_keep_alive_ (const http_parser *parser)
{
  if (parser->http_major > 0 && parser->http_minor > 0) {
    /* HTTP/1.1 */
    if (parser->flags & F_CONNECTION_CLOSE) {
      return 0;
    }
  } else {
    /* HTTP/1.0 or earlier */
    if (!(parser->flags & F_CONNECTION_KEEP_ALIVE)) {
      return 0;
    }
  }

  return !http_message_needs_eof_(parser);
}